

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O0

Identifier __thiscall soul::heart::Parser::parseBlockName(Parser *this)

{
  Allocator *this_00;
  Identifier IVar1;
  undefined1 auVar2 [16];
  CompileMessage local_88;
  char *local_40;
  undefined1 local_38 [8];
  string name;
  Parser *this_local;
  
  name.field_2._8_8_ = this;
  std::__cxx11::string::string
            ((string *)local_38,
             (string *)
             &(this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              ).currentStringValue);
  local_40 = "$blockIdentifier";
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  expect<soul::TokenType>
            (&this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ,(TokenType)"$blockIdentifier");
  auVar2 = std::__cxx11::string::length();
  if (auVar2._0_8_ < 2) {
    Errors::invalidBlockName<std::__cxx11::string&>(&local_88,(Errors *)local_38,auVar2._8_8_);
    (*(this->
      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
      )._vptr_Tokeniser[2])(this,&local_88);
    CompileMessage::~CompileMessage(&local_88);
  }
  this_00 = Program::getAllocator(&this->program);
  IVar1 = Allocator::get<std::__cxx11::string>
                    (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_38);
  std::__cxx11::string::~string((string *)local_38);
  return (Identifier)IVar1.name;
}

Assistant:

Identifier parseBlockName()
    {
        auto name = currentStringValue;
        expect (Token::blockIdentifier);

        if (name.length() < 2)
            throwError (Errors::invalidBlockName (name));

        return program.getAllocator().get (name);
    }